

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O0

void __thiscall
Memory::Recycler::VerifyCheckPadExplicitFreeList(Recycler *this,void *address,size_t size)

{
  ulong uVar1;
  code *pcVar2;
  bool bVar3;
  ulong *corruptedAddress;
  undefined4 *puVar4;
  bool local_41;
  ulong *local_38;
  byte *i;
  size_t padding;
  size_t *paddingAddress;
  size_t size_local;
  void *address_local;
  Recycler *this_local;
  
  corruptedAddress = (ulong *)((long)address + (size - 8));
  uVar1 = *corruptedAddress;
  if (uVar1 == 0xcacacacacacacaca) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                       ,0x1edd,"(padding != (size_t)0xCACACACACACACACA)",
                       "padding != (size_t)0xCACACACACACACACA");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  local_41 = (ulong)this->verifyPad + 8 <= uVar1 && uVar1 < size;
  VerifyCheck((uint)local_41,L"Invalid padding size",address,corruptedAddress);
  for (local_38 = (ulong *)((long)address + (size - uVar1)); local_38 < corruptedAddress;
      local_38 = (ulong *)((long)local_38 + 1)) {
    VerifyCheck((uint)((char)*local_38 == -0x36),L"buffer overflow",address,local_38);
  }
  return;
}

Assistant:

void Recycler::VerifyCheckPadExplicitFreeList(void * address, size_t size)
{
    size_t * paddingAddress = (size_t *)((byte *)address + size - sizeof(size_t));
    size_t padding = *paddingAddress;

#pragma warning(suppress:4310)
    Assert(padding != (size_t)0xCACACACACACACACA);  // Explicit free objects have to have been initialized at some point before they were freed

    Recycler::VerifyCheck(padding >= verifyPad + sizeof(size_t) &&  padding < size, _u("Invalid padding size"), address, paddingAddress);
    for (byte * i = (byte *)address + size - padding; i < (byte *)paddingAddress; i++)
    {
        Recycler::VerifyCheck(*i == Recycler::VerifyMemFill, _u("buffer overflow"), address, i);
    }
}